

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# algorithm.h
# Opt level: O0

plain_range_sorted<CGlyphIndex>
partition_binary<plain_range_sorted<CGlyphIndex>,CGlyphIndex>
          (plain_range_sorted<CGlyphIndex> range,CGlyphIndex value)

{
  plain_range<CGlyphIndex> pVar1;
  bool bVar2;
  uint uVar3;
  CGlyphIndex *pCVar4;
  int __c;
  CGlyphIndex *in_RSI;
  CGlyphIndex *in_RDI;
  long in_FS_OFFSET;
  plain_range_sorted<CGlyphIndex> pVar5;
  uint pivot;
  uint in_stack_ffffffffffffff90;
  uint in_stack_ffffffffffffff94;
  plain_range_sorted<CGlyphIndex> *in_stack_ffffffffffffff98;
  CGlyphIndex *local_58;
  CGlyphIndex *local_50;
  CGlyphIndex *local_48;
  CGlyphIndex *local_40;
  CGlyphIndex local_38;
  plain_range<CGlyphIndex> local_28;
  CGlyphIndex *local_18;
  CGlyphIndex *local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_28.begin = in_RDI;
  local_28.end = in_RSI;
  concept_empty::check<plain_range_sorted<CGlyphIndex>>
            ((plain_range_sorted<CGlyphIndex> *)&local_28);
  concept_index::check<plain_range_sorted<CGlyphIndex>>
            ((plain_range_sorted<CGlyphIndex> *)&local_28);
  concept_size::check<plain_range_sorted<CGlyphIndex>>((plain_range_sorted<CGlyphIndex> *)&local_28)
  ;
  concept_slice::check<plain_range_sorted<CGlyphIndex>>
            ((plain_range_sorted<CGlyphIndex> *)&local_28);
  concept_sorted::check<plain_range_sorted<CGlyphIndex>>
            ((plain_range_sorted<CGlyphIndex> *)&local_28);
  bVar2 = plain_range<CGlyphIndex>::empty(&local_28);
  if (bVar2) {
    local_18 = local_28.begin;
    local_10 = local_28.end;
  }
  else {
    pCVar4 = plain_range<CGlyphIndex>::back
                       ((plain_range<CGlyphIndex> *)
                        CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90));
    bVar2 = operator<(pCVar4,&local_38);
    if (bVar2) {
      plain_range_sorted<CGlyphIndex>::plain_range_sorted
                ((plain_range_sorted<CGlyphIndex> *)0x14661c);
    }
    else {
      while (uVar3 = plain_range<CGlyphIndex>::size(&local_28), 1 < uVar3) {
        uVar3 = plain_range<CGlyphIndex>::size(&local_28);
        pCVar4 = (CGlyphIndex *)
                 plain_range<CGlyphIndex>::index(&local_28,(char *)(ulong)(uVar3 - 1 >> 1),__c);
        bVar2 = operator<(pCVar4,&local_38);
        if (bVar2) {
          plain_range<CGlyphIndex>::size(&local_28);
          pVar5 = plain_range_sorted<CGlyphIndex>::slice
                            (in_stack_ffffffffffffff98,in_stack_ffffffffffffff94,
                             in_stack_ffffffffffffff90);
          local_48 = pVar5.super_plain_range<CGlyphIndex>.begin;
          local_28.begin = local_48;
          local_40 = pVar5.super_plain_range<CGlyphIndex>.end;
          local_28.end = local_40;
        }
        else {
          pVar5 = plain_range_sorted<CGlyphIndex>::slice
                            (in_stack_ffffffffffffff98,in_stack_ffffffffffffff94,
                             in_stack_ffffffffffffff90);
          local_58 = pVar5.super_plain_range<CGlyphIndex>.begin;
          local_28.begin = local_58;
          local_50 = pVar5.super_plain_range<CGlyphIndex>.end;
          local_28.end = local_50;
        }
      }
      local_18 = local_28.begin;
      local_10 = local_28.end;
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  pVar1.end = local_10;
  pVar1.begin = local_18;
  return (plain_range_sorted<CGlyphIndex>)pVar1;
}

Assistant:

R partition_binary(R range, T value)
{
	concept_empty::check(range);
	concept_index::check(range);
	concept_size::check(range);
	concept_slice::check(range);
	concept_sorted::check(range);

	if(range.empty())
		return range;
	if(range.back() < value)
		return R();

	while(range.size() > 1)
	{
		unsigned pivot = (range.size()-1)/2;
		if(range.index(pivot) < value)
			range = range.slice(pivot+1, range.size()-1);
		else
			range = range.slice(0, pivot+1);
	}
	return range;
}